

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

time_t Curl_pp_state_timeout(pingpong *pp)

{
  connectdata *pcVar1;
  Curl_easy *pCVar2;
  long lVar3;
  time_t tVar4;
  long lVar5;
  long lVar6;
  timeval tVar7;
  
  pcVar1 = pp->conn;
  pCVar2 = pcVar1->data;
  lVar5 = (pCVar2->set).server_response_timeout;
  if (lVar5 == 0) {
    lVar5 = pp->response_time;
  }
  tVar7 = curlx_tvnow();
  tVar4 = curlx_tvdiff(tVar7,pp->response);
  lVar5 = lVar5 - tVar4;
  lVar3 = (pCVar2->set).timeout;
  lVar6 = lVar5;
  if (lVar3 != 0) {
    tVar7 = curlx_tvnow();
    tVar4 = curlx_tvdiff(tVar7,pcVar1->now);
    lVar6 = lVar3 - tVar4;
    if (lVar5 < lVar6) {
      lVar6 = lVar5;
    }
  }
  return lVar6;
}

Assistant:

time_t Curl_pp_state_timeout(struct pingpong *pp)
{
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data=conn->data;
  time_t timeout_ms; /* in milliseconds */
  time_t timeout2_ms; /* in milliseconds */
  long response_time= (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_tvdiff(Curl_tvnow(), pp->response); /* spent time */

  if(data->set.timeout) {
    /* if timeout is requested, find out how much remaining time we have */
    timeout2_ms = data->set.timeout - /* timeout time */
      Curl_tvdiff(Curl_tvnow(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}